

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR xpath_substring(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  longdouble lVar1;
  int iVar2;
  lyxp_set *plVar3;
  ly_bool lVar4;
  LY_ERR ret__;
  LY_ERR LVar5;
  char *pcVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  undefined4 uVar13;
  ly_ctx *plVar14;
  ulong uVar15;
  ushort *puVar16;
  long local_68;
  ushort uStack_60;
  short sStack_40;
  
  plVar3 = *args;
  if ((options & 0x1c) == 0) {
    uVar7 = 4;
    LVar5 = lyxp_set_cast(plVar3,LYXP_SET_STRING);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    LVar5 = xpath_round(args + 1,uVar7,args[1],options);
    if (LVar5 != LY_SUCCESS) {
      return ~LY_SUCCESS;
    }
    lVar1 = *(longdouble *)&args[1]->val;
    uStack_60 = (ushort)((unkuint10)lVar1 >> 0x40);
    local_68 = SUB108(lVar1,0);
    if (((unkuint10)lVar1 & 0x7fff) == 0 ||
        (ushort)((uStack_60 & 0x7fff) - 1) < 0x7ffe && local_68 < 0) {
      uVar12 = (ulong)ROUND(-(longdouble)1 + lVar1);
    }
    else {
      uVar12 = (long)(short)uStack_60 >> 0xf ^ 0x7fffffff;
      if ((~uStack_60 & 0x7fff) != 0 || local_68 != -0x8000000000000000) {
        uVar12 = 0x7fffffff;
      }
    }
    lVar11 = 0x7fffffff;
    if (arg_count == 3) {
      LVar5 = xpath_round(args + 2,uVar7,args[2],options);
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
      lVar1 = (args[2]->val).num;
      sStack_40 = (short)((unkuint10)lVar1 >> 0x40);
      if (sStack_40 < 0 || NAN(lVar1)) {
        lVar11 = 0;
      }
      else {
        lVar11 = 0x7fffffff;
        if (lVar1 != (longdouble)INFINITY) {
          lVar11 = (long)(int)ROUND(lVar1);
        }
      }
    }
    pcVar6 = ((*args)->val).str;
    if (*pcVar6 == '\0') {
      uVar12 = 0;
      uVar7 = 0;
    }
    else {
      uVar15 = 0;
      uVar9 = 1;
      uVar7 = 0;
      uVar8 = 0;
      do {
        if ((long)uVar15 < (long)uVar12) {
          uVar8 = uVar8 + 1;
        }
        else {
          if ((long)(lVar11 + uVar12) <= (long)uVar15) break;
          uVar7 = uVar7 + 1;
        }
        uVar15 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
      } while (pcVar6[uVar15] != '\0');
      uVar12 = (ulong)uVar8;
    }
    set_fill_string(set,pcVar6 + uVar12,uVar7);
    return LY_SUCCESS;
  }
  if (plVar3->type == LYXP_SET_SCNODE_SET) {
    uVar7 = plVar3->used;
    puVar16 = (ushort *)0x0;
    do {
      uVar7 = uVar7 - 1;
      if (*(int *)((long)(plVar3->val).nodes + (ulong)uVar7 * 0x18 + 0xc) == 2) {
        puVar16 = *(ushort **)((long)(plVar3->val).nodes + (ulong)uVar7 * 0x18);
        break;
      }
    } while (uVar7 != 0);
    if (puVar16 != (ushort *)0x0) {
      if ((*puVar16 & 0xc) == 0) {
        plVar14 = set->ctx;
        pcVar6 = lys_nodetype2str(*puVar16);
        pcVar10 = "Argument #1 of %s is a %s node \"%s\".";
      }
      else {
        lVar4 = warn_is_string_type(*(lysc_type **)(puVar16 + 0x30));
        if (lVar4 != '\0') goto LAB_001b651a;
        plVar14 = set->ctx;
        pcVar6 = *(char **)(puVar16 + 0x14);
        pcVar10 = "Argument #1 of %s is node \"%s\", not of string-type.";
      }
      ly_log(plVar14,LY_LLWRN,LY_SUCCESS,pcVar10,"xpath_substring",pcVar6);
    }
  }
LAB_001b651a:
  plVar3 = args[1];
  if (plVar3->type == LYXP_SET_SCNODE_SET) {
    uVar8 = plVar3->used;
    puVar16 = (ushort *)0x0;
    do {
      uVar8 = uVar8 - 1;
      if (*(int *)((long)(plVar3->val).nodes + (ulong)uVar8 * 0x18 + 0xc) == 2) {
        puVar16 = *(ushort **)((long)(plVar3->val).nodes + (ulong)uVar8 * 0x18);
        break;
      }
    } while (uVar8 != 0);
    if (puVar16 != (ushort *)0x0) {
      if ((*puVar16 & 0xc) == 0) {
        plVar14 = set->ctx;
        pcVar6 = lys_nodetype2str(*puVar16);
        pcVar10 = "Argument #2 of %s is a %s node \"%s\".";
      }
      else {
        lVar4 = warn_is_numeric_type(*(lysc_type **)(puVar16 + 0x30));
        if (lVar4 != '\0') goto LAB_001b65c1;
        plVar14 = set->ctx;
        pcVar6 = *(char **)(puVar16 + 0x14);
        pcVar10 = "Argument #2 of %s is node \"%s\", not of numeric type.";
      }
      ly_log(plVar14,LY_LLWRN,LY_SUCCESS,pcVar10,"xpath_substring",pcVar6);
    }
  }
LAB_001b65c1:
  if ((arg_count == 3) && (plVar3 = args[2], plVar3->type == LYXP_SET_SCNODE_SET)) {
    uVar8 = plVar3->used;
    puVar16 = (ushort *)0x0;
    do {
      uVar8 = uVar8 - 1;
      if (*(int *)((long)(plVar3->val).nodes + (ulong)uVar8 * 0x18 + 0xc) == 2) {
        puVar16 = *(ushort **)((long)(plVar3->val).nodes + (ulong)uVar8 * 0x18);
        break;
      }
    } while (uVar8 != 0);
    if (puVar16 != (ushort *)0x0) {
      if ((*puVar16 & 0xc) == 0) {
        plVar14 = set->ctx;
        pcVar6 = lys_nodetype2str(*puVar16);
        pcVar10 = "Argument #3 of %s is a %s node \"%s\".";
      }
      else {
        lVar4 = warn_is_numeric_type(*(lysc_type **)(puVar16 + 0x30));
        if (lVar4 != '\0') goto LAB_001b666d;
        plVar14 = set->ctx;
        pcVar6 = *(char **)(puVar16 + 0x14);
        pcVar10 = "Argument #3 of %s is node \"%s\", not of numeric type.";
      }
      ly_log(plVar14,LY_LLWRN,LY_SUCCESS,pcVar10,"xpath_substring",pcVar6);
    }
  }
LAB_001b666d:
  uVar8 = set->used;
  if ((ulong)uVar8 != 0) {
    lVar11 = 0;
    do {
      iVar2 = *(int *)((long)&((set->val).nodes)->pos + lVar11);
      if (iVar2 == 2) {
        uVar13 = 1;
LAB_001b669d:
        *(undefined4 *)((long)&((set->val).nodes)->pos + lVar11) = uVar13;
      }
      else if (iVar2 == -2) {
        uVar13 = 0xffffffff;
        goto LAB_001b669d;
      }
      lVar11 = lVar11 + 0x18;
    } while ((ulong)uVar8 * 0x18 != lVar11);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_substring(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    int64_t start;
    int32_t len;
    uint32_t str_start, str_len, pos;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }

        if ((args[1]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_numeric_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #2 of %s is node \"%s\", not of numeric type.", __func__, sleaf->name);
            }
        }

        if ((arg_count == 3) && (args[2]->type == LYXP_SET_SCNODE_SET) &&
                (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[2]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #3 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_numeric_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #3 of %s is node \"%s\", not of numeric type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    /* start */
    if (xpath_round(&args[1], 1, args[1], options)) {
        return -1;
    }
    if (isfinite(args[1]->val.num)) {
        start = args[1]->val.num - 1;
    } else if (isinf(args[1]->val.num) && signbit(args[1]->val.num)) {
        start = INT32_MIN;
    } else {
        start = INT32_MAX;
    }

    /* len */
    if (arg_count == 3) {
        rc = xpath_round(&args[2], 1, args[2], options);
        LY_CHECK_RET(rc);
        if (isnan(args[2]->val.num) || signbit(args[2]->val.num)) {
            len = 0;
        } else if (isfinite(args[2]->val.num)) {
            len = args[2]->val.num;
        } else {
            len = INT32_MAX;
        }
    } else {
        len = INT32_MAX;
    }

    /* find matching character positions */
    str_start = 0;
    str_len = 0;
    for (pos = 0; args[0]->val.str[pos]; ++pos) {
        if (pos < start) {
            ++str_start;
        } else if (pos < start + len) {
            ++str_len;
        } else {
            break;
        }
    }

    set_fill_string(set, args[0]->val.str + str_start, str_len);
    return LY_SUCCESS;
}